

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O2

int __thiscall
booster::locale::util::gregorian_calendar::get_value
          (gregorian_calendar *this,period_mark p,value_type v)

{
  int iVar1;
  int iVar2;
  
  switch(p) {
  case era:
    goto switchD_001ad6b0_caseD_1;
  case year:
  case extended_year:
    if (v < current) {
switchD_001ad6b0_caseD_1:
      return 1;
    }
    if (v - least_maximum < 3) {
      return 0x7fffffff;
    }
    if (v == current) {
      return (this->tm_).tm_year + 0x76c;
    }
    break;
  case month:
    if (greatest_minimum < v) {
      if (v - least_maximum < 3) {
        return 0xb;
      }
      if (v == current) {
        return (this->tm_).tm_mon;
      }
    }
    break;
  case day:
    switch(v) {
    case absolute_minimum:
    case actual_minimum:
    case greatest_minimum:
      goto switchD_001ad6b0_caseD_1;
    case current:
      return (this->tm_).tm_mday;
    case least_maximum:
      return 0x1c;
    case actual_maximum:
      iVar2 = anon_unknown_0::days_in_month((this->tm_).tm_year + 0x76c,(this->tm_).tm_mon + 1);
      return iVar2;
    case absolute_maximum:
      return 0x1f;
    }
    break;
  case day_of_year:
    switch(v) {
    case absolute_minimum:
    case actual_minimum:
    case greatest_minimum:
      goto switchD_001ad6b0_caseD_1;
    case current:
      iVar2 = (this->tm_).tm_yday;
      goto LAB_001ad6d4;
    case least_maximum:
      return 0x16d;
    case actual_maximum:
      iVar2 = anon_unknown_0::is_leap((this->tm_).tm_year + 0x76c);
      return 0x16e - (uint)(iVar2 == 0);
    case absolute_maximum:
      return 0x16e;
    }
    break;
  case day_of_week:
    if (v < current) {
      return 1;
    }
    if (v - least_maximum < 3) {
      return 7;
    }
    if (v == current) {
      iVar2 = (this->tm_).tm_wday;
      goto LAB_001ad6d4;
    }
    break;
  case day_of_week_in_month:
    switch(v) {
    case absolute_minimum:
    case actual_minimum:
    case greatest_minimum:
      goto switchD_001ad6b0_caseD_1;
    case current:
      iVar2 = ((this->tm_).tm_mday + -1) / 7;
      goto LAB_001ad6d4;
    case least_maximum:
switchD_001ad6b0_caseD_1:
      return 4;
    case actual_maximum:
      if ((this->tm_).tm_mon != 1) {
        return 5;
      }
      iVar2 = anon_unknown_0::is_leap((this->tm_).tm_year + 0x76c);
      if (iVar2 == 0) {
        return 4;
      }
      return 5;
    case absolute_maximum:
switchD_001ad6b0_caseD_1:
      return 5;
    }
    break;
  case day_of_week_local:
    if (v < current) {
      return 1;
    }
    if (v - least_maximum < 3) {
      return 7;
    }
    if (v == current) {
      iVar2 = (((this->tm_).tm_wday - this->first_day_of_week_) + 7) % 7;
      goto LAB_001ad6d4;
    }
    break;
  case hour:
    if (greatest_minimum < v) {
      if (v - least_maximum < 3) {
        return 0x17;
      }
      if (v == current) {
        return (this->tm_).tm_hour;
      }
    }
    break;
  case hour_12:
    if (greatest_minimum < v) {
      if (v - least_maximum < 3) {
        return 0xb;
      }
      if (v == current) {
        return (this->tm_).tm_hour % 0xc;
      }
    }
    break;
  case am_pm:
    if (greatest_minimum < v) {
      if (v - least_maximum < 3) {
        return 1;
      }
      if (v == current) {
        return (uint)(0xb < (this->tm_).tm_hour);
      }
    }
    break;
  case minute:
    if (greatest_minimum < v) {
      if (v - least_maximum < 3) {
        return 0x3b;
      }
      if (v == current) {
        return (this->tm_).tm_min;
      }
    }
    break;
  case second:
    if (greatest_minimum < v) {
      if (v - least_maximum < 3) {
        return 0x3b;
      }
      if (v == current) {
        return (this->tm_).tm_sec;
      }
    }
    break;
  case week_of_year:
    switch(v) {
    case absolute_minimum:
    case actual_minimum:
    case greatest_minimum:
      goto switchD_001ad6b0_caseD_1;
    case current:
      iVar1 = get_week_number(this,(this->tm_).tm_yday,(this->tm_).tm_wday);
      iVar2 = 0x35;
LAB_001ad815:
      if (-1 < iVar1) {
        return iVar1;
      }
      return iVar2;
    case least_maximum:
      return 0x34;
    case actual_maximum:
      iVar2 = anon_unknown_0::is_leap((this->tm_).tm_year + 0x76c);
      iVar2 = 0x16d - (uint)(iVar2 == 0);
      iVar1 = iVar2 - (this->tm_).tm_yday;
LAB_001ad979:
      iVar2 = get_week_number(this,iVar2,(iVar1 + (this->tm_).tm_wday) % 7);
      return iVar2;
    case absolute_maximum:
      return 0x35;
    }
    break;
  case week_of_month:
    switch(v) {
    case absolute_minimum:
    case actual_minimum:
    case greatest_minimum:
      goto switchD_001ad6b0_caseD_1;
    case current:
      iVar1 = get_week_number(this,(this->tm_).tm_mday,(this->tm_).tm_wday);
      iVar2 = 5;
      goto LAB_001ad815;
    case least_maximum:
      goto switchD_001ad6b0_caseD_1;
    case actual_maximum:
      iVar2 = anon_unknown_0::days_in_month((this->tm_).tm_year + 0x76c,(this->tm_).tm_mon + 1);
      iVar1 = iVar2 - (this->tm_).tm_mday;
      goto LAB_001ad979;
    case absolute_maximum:
      goto switchD_001ad6b0_caseD_1;
    }
    break;
  case first_day_of_week:
    iVar2 = this->first_day_of_week_;
LAB_001ad6d4:
    p = iVar2 + era;
    goto switchD_001ad6b0_caseD_1;
  }
  p = invalid;
switchD_001ad6b0_caseD_1:
  return p;
}

Assistant:

virtual int get_value(period::marks::period_mark p,value_type v) const 
            {
                using namespace period::marks;
                switch(p) {
                case era:
                    return 1;
                case year:
                case extended_year:
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        #ifdef BOOSTER_WIN_NATIVE
                        return 1970; // Unix epoch windows can't handle negative time_t
                        #else
                        if(sizeof(std::time_t) == 4)
                            return 1901; // minimal year with 32 bit time_t
                        else
                            return 1; 
                        #endif
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        if(sizeof(std::time_t) == 4)
                            return 2038; // Y2K38 - maximal with 32 bit time_t
                        else
                            return std::numeric_limits<int>::max();
                    case current:
                        return tm_.tm_year + 1900;
                    };
                    break;
                case month:
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 11;
                    case current:
                        return tm_.tm_mon;
                    };
                    break;
                case day:
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 31;
                    case least_maximum:
                        return 28;
                    case actual_maximum:
                        return days_in_month(tm_.tm_year + 1900,tm_.tm_mon + 1);
                    case current:
                        return tm_.tm_mday;
                    };
                    break;
                case day_of_year:                ///< The number of day in year, starting from 1
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 366;
                    case least_maximum:
                        return 365;
                    case actual_maximum:
                        return is_leap(tm_.tm_year + 1900) ? 366 : 365;
                    case current:
                        return tm_.tm_yday + 1;
                    }
                    break;
                case day_of_week:                ///< Day of week, starting from Sunday, [1..7]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 7;
                    case current:
                        return tm_.tm_wday + 1;
                    }
                    break;
                case day_of_week_local:     ///< Local day of week, for example in France Monday is 1, in US Sunday is 1, [1..7]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 7;
                    case current:
                        return (tm_.tm_wday - first_day_of_week_ + 7) % 7 + 1;
                    }
                    break;
                case hour:                       ///< 24 clock hour [0..23]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 23;
                    case current:
                        return tm_.tm_hour;
                    }
                    break;
                case hour_12:                    ///< 12 clock hour [0..11]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 11;
                    case current:
                        return tm_.tm_hour % 12;
                    }
                    break;
                case am_pm:                      ///< am or pm marker, [0..1]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 1;
                    case current:
                        return tm_.tm_hour >= 12 ? 1 : 0;
                    }
                    break;
                case minute:                     ///< minute [0..59]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 59;
                    case current:
                        return tm_.tm_min;
                    }
                    break;
                case second:                     ///< second [0..59]
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 0;
                    case absolute_maximum:
                    case least_maximum:
                    case actual_maximum:
                        return 59;
                    case current:
                        return tm_.tm_sec;
                    }
                    break;
                case period::marks::first_day_of_week:          ///< For example Sunday in US, Monday in France
                    return first_day_of_week_ + 1;
                
                case week_of_year:               ///< The week number in the year
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 53;
                    case least_maximum:
                        return 52;
                    case actual_maximum:
                        {
                            int year = tm_.tm_year + 1900;
                            int end_of_year_days = (is_leap(year) ? 366 : 365) - 1;
                            int dow_of_end_of_year = (end_of_year_days - tm_.tm_yday + tm_.tm_wday) % 7;
                            return get_week_number(end_of_year_days,dow_of_end_of_year);
                        }
                    case current:
                        {
                            int val = get_week_number(tm_.tm_yday,tm_.tm_wday);
                            if(val < 0)
                                return 53;
                            return val;
                        }
                    }
                case week_of_month:              ///< The week number withing current month
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 5;
                    case least_maximum:
                        return 4;
                    case actual_maximum:
                        {
                            int end_of_month_days = days_in_month(tm_.tm_year + 1900,tm_.tm_mon + 1);
                            int dow_of_end_of_month = (end_of_month_days - tm_.tm_mday + tm_.tm_wday) % 7;
                            return get_week_number(end_of_month_days,dow_of_end_of_month);
                        }
                    case current:
                        {
                            int val = get_week_number(tm_.tm_mday,tm_.tm_wday);
                            if(val < 0)
                                return 5;
                            return val;
                        }
                    }

                case day_of_week_in_month:       ///< Original number of the day of the week in month.
                    switch(v) {
                    case absolute_minimum:
                    case greatest_minimum:
                    case actual_minimum:
                        return 1;
                    case absolute_maximum:
                        return 5;
                    case least_maximum:
                        return 4;
                    case actual_maximum:
                        if(tm_.tm_mon == 1 && !is_leap(tm_.tm_year + 1900)) {
                            // only in february in non leap year is 28 days, the rest
                            // conver more then 4 weeks
                            return 4;
                        }
                        return 5;
                    case current:
                        return (tm_.tm_mday - 1) / 7 + 1;
                    default:
                        ;
                    }
                default:
                    ;
                }
                return 0;
 
            }